

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2NullVsEmptyString(void)

{
  bool bVar1;
  RE2 re;
  LogMessage local_268;
  RE2 local_e8;
  
  RE2::RE2(&local_e8,".*");
  if (local_e8.error_code_ != NoError) {
    LogMessage::LogMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x589,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_268 + 8),"Check failed: re.ok()",0x15);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_268);
  }
  local_268._0_8_ = (char *)0x0;
  local_268._8_4_ = 0;
  bVar1 = RE2::FullMatchN((StringPiece *)&local_268,&local_e8,(Arg **)0x0,0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x58c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_268 + 8),"Check failed: RE2::FullMatch(null, re)",0x26);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_268);
  }
  local_268._0_8_ = "";
  local_268._8_4_ = 0;
  bVar1 = RE2::FullMatchN((StringPiece *)&local_268,&local_e8,(Arg **)0x0,0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x58f,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_268 + 8),"Check failed: RE2::FullMatch(empty, re)",0x27);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_268);
  }
  RE2::~RE2(&local_e8);
  return;
}

Assistant:

TEST(RE2, NullVsEmptyString) {
  RE2 re(".*");
  EXPECT_TRUE(re.ok());

  StringPiece null;
  EXPECT_TRUE(RE2::FullMatch(null, re));

  StringPiece empty("");
  EXPECT_TRUE(RE2::FullMatch(empty, re));
}